

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateUnaryOp(ExpressionEvalContext *ctx,ExprUnaryOp *expression)

{
  int iVar1;
  ExprUnaryOp *ctx_00;
  bool bVar2;
  StackFrame **ppSVar3;
  ExpressionEvalContext *this;
  ExprBase *pEVar4;
  ExprBase *pEVar5;
  ExprIntegerLiteral *pEVar6;
  ExprRationalLiteral *pEVar7;
  ExprMemoryLiteral *memory;
  TypeRef *type;
  void *local_68;
  void *lPtr_1;
  ExprMemoryLiteral *memLiteral;
  ExprPointerLiteral *tmp;
  void *lPtr;
  double result_1;
  longlong result;
  ExprIntegerLiteral *expr_1;
  ExprBoolLiteral *expr;
  ExprBase *value;
  ExprUnaryOp *expression_local;
  ExpressionEvalContext *ctx_local;
  
  value = &expression->super_ExprBase;
  expression_local = (ExprUnaryOp *)ctx;
  bVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((bVar2) ||
     (ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                          ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                           &(expression_local->super_ExprBase).next), (*ppSVar3)->targetYield == 0))
  {
    bVar2 = AddInstruction((ExpressionEvalContext *)expression_local);
    if (bVar2) {
      expr = (ExprBoolLiteral *)
             Evaluate((ExpressionEvalContext *)expression_local,(ExprBase *)value[1]._vptr_ExprBase)
      ;
      if ((ExprBase *)expr == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        if (((ExprBase *)expr)->type ==
            (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138]) {
          expr_1 = (ExprIntegerLiteral *)getType<ExprBoolLiteral>((ExprBase *)expr);
          pEVar5 = value;
          if (expr_1 == (ExprIntegerLiteral *)0x0) {
            result = (longlong)getType<ExprIntegerLiteral>(&expr->super_ExprBase);
            pEVar5 = value;
            if (((ExprIntegerLiteral *)result != (ExprIntegerLiteral *)0x0) &&
               (*(int *)&value->field_0x2c == 4)) {
              pEVar4 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)
                                   (expression_local->super_ExprBase)._vptr_ExprBase)->
                        super_ExprBase;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar4,value->source,value->type,
                         (bool)((*(long *)(result + 0x30) != 0 ^ 0xffU) & 1));
              pEVar5 = CheckType(pEVar5,pEVar4);
              return pEVar5;
            }
          }
          else if (*(int *)&value->field_0x2c == 4) {
            pEVar4 = &ExpressionContext::get<ExprBoolLiteral>
                                ((ExpressionContext *)
                                 (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase;
            ExprBoolLiteral::ExprBoolLiteral
                      ((ExprBoolLiteral *)pEVar4,value->source,value->type,
                       (bool)(((expr_1->super_ExprBase).field_0x29 ^ 0xff) & 1));
            pEVar5 = CheckType(pEVar5,pEVar4);
            return pEVar5;
          }
        }
        else {
          bVar2 = ExpressionContext::IsIntegerType
                            ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                             ((ExprBase *)expr)->type);
          if (bVar2) {
            result_1 = 0.0;
            bVar2 = TryTakeLong(&expr->super_ExprBase,(longlong *)&result_1);
            pEVar5 = value;
            if (bVar2) {
              switch(*(undefined4 *)&value->field_0x2c) {
              case 1:
                pEVar6 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)
                                    (expression_local->super_ExprBase)._vptr_ExprBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar6,value->source,value->type,(longlong)result_1);
                pEVar5 = CheckType(pEVar5,&pEVar6->super_ExprBase);
                return pEVar5;
              case 2:
                pEVar6 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)
                                    (expression_local->super_ExprBase)._vptr_ExprBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar6,value->source,value->type,-(long)result_1);
                pEVar5 = CheckType(pEVar5,&pEVar6->super_ExprBase);
                return pEVar5;
              case 3:
                pEVar6 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)
                                    (expression_local->super_ExprBase)._vptr_ExprBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar6,value->source,value->type,(ulong)result_1 ^ 0xffffffffffffffff);
                pEVar5 = CheckType(pEVar5,&pEVar6->super_ExprBase);
                return pEVar5;
              case 4:
                pEVar6 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)
                                    (expression_local->super_ExprBase)._vptr_ExprBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar6,value->source,value->type,(ulong)((result_1 != 0.0 ^ 0xffU) & 1));
                pEVar5 = CheckType(pEVar5,&pEVar6->super_ExprBase);
                return pEVar5;
              default:
                __assert_fail("!\"unknown unary operation\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                              ,0x57b,
                              "ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
              }
            }
          }
          else {
            bVar2 = ExpressionContext::IsFloatingPointType
                              ((ExpressionContext *)
                               (expression_local->super_ExprBase)._vptr_ExprBase,
                               (expr->super_ExprBase).type);
            if (bVar2) {
              lPtr = (void *)0x0;
              bVar2 = TryTakeDouble(&expr->super_ExprBase,(double *)&lPtr);
              pEVar5 = value;
              if (bVar2) {
                iVar1 = *(int *)&value->field_0x2c;
                if (iVar1 == 1) {
                  pEVar7 = ExpressionContext::get<ExprRationalLiteral>
                                     ((ExpressionContext *)
                                      (expression_local->super_ExprBase)._vptr_ExprBase);
                  ExprRationalLiteral::ExprRationalLiteral
                            (pEVar7,value->source,value->type,(double)lPtr);
                  pEVar5 = CheckType(pEVar5,&pEVar7->super_ExprBase);
                  return pEVar5;
                }
                if (iVar1 != 2) {
                  if (iVar1 - 3U < 2) {
                    return (ExprBase *)0x0;
                  }
                  __assert_fail("!\"unknown unary operation\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                                ,0x58f,
                                "ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)")
                  ;
                }
                pEVar7 = ExpressionContext::get<ExprRationalLiteral>
                                   ((ExpressionContext *)
                                    (expression_local->super_ExprBase)._vptr_ExprBase);
                ExprRationalLiteral::ExprRationalLiteral
                          (pEVar7,value->source,value->type,-(double)lPtr);
                pEVar5 = CheckType(pEVar5,&pEVar7->super_ExprBase);
                return pEVar5;
              }
            }
            else {
              bVar2 = isType<TypeRef>((expr->super_ExprBase).type);
              if (bVar2) {
                tmp = (ExprPointerLiteral *)0x0;
                bVar2 = isType<ExprNullptrLiteral>(&expr->super_ExprBase);
                if (bVar2) {
                  tmp = (ExprPointerLiteral *)0x0;
                }
                else {
                  memLiteral = (ExprMemoryLiteral *)
                               getType<ExprPointerLiteral>(&expr->super_ExprBase);
                  if ((ExprPointerLiteral *)memLiteral == (ExprPointerLiteral *)0x0) {
                    __assert_fail("!\"unknown type\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                                  ,0x59c,
                                  "ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)"
                                 );
                  }
                  tmp = (ExprPointerLiteral *)((ExprPointerLiteral *)memLiteral)->ptr;
                }
                pEVar5 = value;
                if (*(int *)&value->field_0x2c == 4) {
                  pEVar4 = &ExpressionContext::get<ExprBoolLiteral>
                                      ((ExpressionContext *)
                                       (expression_local->super_ExprBase)._vptr_ExprBase)->
                            super_ExprBase;
                  ExprBoolLiteral::ExprBoolLiteral
                            ((ExprBoolLiteral *)pEVar4,value->source,
                             (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138],
                             (bool)((tmp != (ExprPointerLiteral *)0x0 ^ 0xffU) & 1));
                  pEVar5 = CheckType(pEVar5,pEVar4);
                  return pEVar5;
                }
              }
              else if ((expr->super_ExprBase).type ==
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1144]) {
                memory = getType<ExprMemoryLiteral>(&expr->super_ExprBase);
                ctx_00 = expression_local;
                local_68 = (void *)0x0;
                lPtr_1 = memory;
                type = ExpressionContext::GetReferenceType
                                 ((ExpressionContext *)
                                  (expression_local->super_ExprBase)._vptr_ExprBase,
                                  (TypeBase *)
                                  (expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
                pEVar5 = CreateExtract((ExpressionEvalContext *)ctx_00,memory,4,
                                       &type->super_TypeBase);
                bVar2 = TryTakePointer(pEVar5,&local_68);
                pEVar5 = value;
                if (!bVar2) {
                  pEVar5 = Report((ExpressionEvalContext *)expression_local,
                                  "ERROR: failed to evaluate auto ref value");
                  return pEVar5;
                }
                pEVar4 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)
                                     (expression_local->super_ExprBase)._vptr_ExprBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar4,value->source,
                           (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138],
                           (bool)((local_68 != (void *)0x0 ^ 0xffU) & 1));
                pEVar5 = CheckType(pEVar5,pEVar4);
                return pEVar5;
              }
            }
          }
        }
        ctx_local = (ExpressionEvalContext *)
                    Report((ExpressionEvalContext *)expression_local,
                           "ERROR: failed to eval unary op");
      }
    }
    else {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
  }
  else {
    this = (ExpressionEvalContext *)
           ExpressionContext::get<ExprVoid>
                     ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprVoid::ExprVoid((ExprVoid *)this,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    ctx_local = this;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateUnaryOp(ExpressionEvalContext &ctx, ExprUnaryOp *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(value->type == ctx.ctx.typeBool)
	{
		if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
		else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
	}
	else if(ctx.ctx.IsIntegerType(value->type))
	{
		long long result = 0;

		if(TryTakeLong(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, ~result));
			case SYN_UNARY_OP_LOGICAL_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, !result));
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(ctx.ctx.IsFloatingPointType(value->type))
	{
		double result = 0.0;

		if(TryTakeDouble(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
			case SYN_UNARY_OP_LOGICAL_NOT:
				return NULL;
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(value))
			lPtr = NULL;
		else if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			lPtr = tmp->ptr;
		else
			assert(!"unknown type");

		if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));
	}
	else if(value->type == ctx.ctx.typeAutoRef)
	{
		ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

		void *lPtr = 0;
		if(!TryTakePointer(CreateExtract(ctx, memLiteral, 4, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid)), lPtr))
			return Report(ctx, "ERROR: failed to evaluate auto ref value");

		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));

	}

	return Report(ctx, "ERROR: failed to eval unary op");
}